

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlDOMWrapReconcileNamespaces(xmlDOMWrapCtxtPtr_conflict ctxt,xmlNodePtr elem,int options)

{
  xmlElementType xVar1;
  xmlChar *pxVar2;
  _xmlDoc *p_Var3;
  xmlNsPtr pxVar4;
  xmlNsMapItemPtr pxVar5;
  bool bVar6;
  bool bVar7;
  _xmlNs **pp_Var8;
  xmlNodePtr pxVar9;
  xmlNs *pxVar10;
  int iVar11;
  xmlNsMapItemPtr_conflict pxVar12;
  xmlNsPtr *ppxVar13;
  xmlNsMapItemPtr pxVar14;
  int iVar15;
  _xmlNode *p_Var16;
  xmlNodePtr elem_00;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  xmlNs *pxVar20;
  xmlNsPtr *ppxVar21;
  xmlNsMapPtr nsMap;
  int nbRedund;
  xmlNsPtr *listRedund;
  int sizeRedund;
  int in_stack_ffffffffffffff80;
  xmlNsMapItemPtr local_78;
  xmlNs *local_70;
  int local_64;
  undefined8 local_60;
  xmlNsPtr *local_58;
  int local_50;
  int local_4c;
  xmlNodePtr local_48;
  _xmlDoc *local_40;
  xmlNs *local_38;
  
  local_50 = options;
  local_78 = (xmlNsMapItemPtr_conflict)0x0;
  local_58 = (xmlNsPtr *)0x0;
  local_4c = 0;
  local_64 = 0;
  if (((elem == (xmlNodePtr)0x0) || (elem->doc == (_xmlDoc *)0x0)) ||
     (elem->type != XML_ELEMENT_NODE)) {
    return -1;
  }
  local_40 = elem->doc;
  iVar15 = -1;
  local_60 = 0;
  elem_00 = (xmlNodePtr)0x0;
  uVar18 = 0;
  uVar17 = 0;
  pxVar9 = elem;
LAB_0014f62b:
  do {
    p_Var16 = pxVar9;
    if (p_Var16->type == XML_ATTRIBUTE_NODE) {
LAB_0014f84a:
      if (p_Var16->ns != (xmlNs *)0x0) {
        if ((int)local_60 == 0) {
          p_Var3 = (_xmlDoc *)elem->parent;
          local_60 = 1;
          if (((p_Var3 != (_xmlDoc *)0x0) && (p_Var3->doc != p_Var3)) &&
             (iVar11 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_78,(xmlNodePtr)p_Var3),
             uVar17 = uVar18, iVar11 == -1)) {
            uVar17 = 0xffffffff;
            uVar18 = uVar17;
          }
        }
        if ((local_58 != (xmlNsPtr *)0x0) && (0 < local_64)) {
          ppxVar13 = local_58 + 1;
          iVar11 = local_64;
          do {
            if (p_Var16->ns == ppxVar13[-1]) {
              p_Var16->ns = *ppxVar13;
              break;
            }
            ppxVar13 = ppxVar13 + 2;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
        if (local_78 != (xmlNsMapItemPtr_conflict)0x0) {
          for (pxVar12 = local_78->next; pxVar12 != (xmlNsMapItemPtr_conflict)0x0;
              pxVar12 = pxVar12->next) {
            if ((pxVar12->shadowDepth == -1) && (p_Var16->ns == pxVar12->oldNs)) {
              ppxVar13 = &pxVar12->newNs;
              goto LAB_0014f91c;
            }
          }
        }
        ppxVar13 = &local_70;
        iVar11 = xmlDOMWrapNSNormAcquireNormalizedNs
                           (local_40,elem_00,p_Var16->ns,ppxVar13,(xmlNsMapPtr *)&local_78,iVar15,
                            (uint)(p_Var16->type == XML_ATTRIBUTE_NODE),in_stack_ffffffffffffff80);
        uVar17 = uVar18;
        if (iVar11 == -1) {
          uVar18 = 0xffffffff;
          uVar17 = 0xffffffff;
        }
LAB_0014f91c:
        p_Var16->ns = *ppxVar13;
      }
    }
    else {
      if (p_Var16->type != XML_ELEMENT_NODE) goto LAB_0014f958;
      iVar15 = iVar15 + 1;
      if (p_Var16->nsDef == (xmlNs *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = true;
        pxVar20 = (xmlNs *)0x0;
        local_70 = p_Var16->nsDef;
        local_48 = elem;
        do {
          if ((int)local_60 == 0) {
            p_Var3 = (_xmlDoc *)local_48->parent;
            local_60 = 1;
            if (((p_Var3 != (_xmlDoc *)0x0) && (p_Var3->doc != p_Var3)) &&
               (iVar11 = xmlDOMWrapNSNormGatherInScopeNs
                                   ((xmlNsMapPtr *)&local_78,(xmlNodePtr)p_Var3), uVar18 = uVar17,
               iVar11 == -1)) {
              uVar17 = 0xffffffff;
              uVar18 = uVar17;
            }
          }
          pxVar10 = local_38;
          if ((local_78 != (xmlNsMapItemPtr_conflict)0x0 & (byte)local_50) == 1) {
            for (pxVar12 = local_78->next; local_38 = pxVar20,
                pxVar12 != (xmlNsMapItemPtr_conflict)0x0; pxVar12 = pxVar12->next) {
              uVar19 = uVar17;
              if ((-2 < pxVar12->depth) && (pxVar12->shadowDepth == -1)) {
                pxVar2 = pxVar12->newNs->prefix;
                if ((local_70->prefix == pxVar2) ||
                   (iVar11 = xmlStrEqual(local_70->prefix,pxVar2), iVar11 != 0)) {
                  pxVar2 = pxVar12->newNs->href;
                  if ((local_70->href == pxVar2) ||
                     (iVar11 = xmlStrEqual(local_70->href,pxVar2), iVar11 != 0)) {
                    iVar11 = xmlDOMWrapNSNormAddNsMapItem2
                                       (&local_58,&local_4c,&local_64,local_70,pxVar12->newNs);
                    uVar19 = 0xffffffff;
                    if (iVar11 != -1) {
                      if (local_38 == (xmlNs *)0x0) {
                        p_Var16->nsDef = local_70->next;
                        pxVar20 = (xmlNs *)0x0;
                      }
                      else {
                        local_38->next = local_70->next;
                        pxVar20 = local_38;
                      }
                      goto LAB_0014f7d3;
                    }
                  }
                }
              }
              pxVar20 = local_38;
              uVar17 = uVar19;
              pxVar10 = local_38;
              uVar18 = uVar19;
            }
          }
          local_38 = pxVar10;
          bVar7 = p_Var16->ns != local_70;
          if (!bVar6) {
            bVar7 = bVar6;
          }
          if (p_Var16->ns != (xmlNs *)0x0) {
            bVar6 = bVar7;
          }
          if (local_78 != (xmlNsMapItemPtr_conflict)0x0) {
            for (pxVar12 = local_78->next; pxVar12 != (xmlNsMapItemPtr_conflict)0x0;
                pxVar12 = pxVar12->next) {
              if ((-2 < pxVar12->depth) && (pxVar12->shadowDepth == -1)) {
                pxVar2 = pxVar12->newNs->prefix;
                if ((local_70->prefix == pxVar2) ||
                   (iVar11 = xmlStrEqual(local_70->prefix,pxVar2), iVar11 != 0)) {
                  pxVar12->shadowDepth = iVar15;
                }
              }
            }
          }
          pxVar12 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&local_78,-1,local_70,local_70,iVar15);
          uVar17 = -(uint)(pxVar12 == (xmlNsMapItemPtr_conflict)0x0) | uVar17;
          pxVar20 = local_70;
          uVar18 = uVar17;
LAB_0014f7d3:
          pp_Var8 = &local_70->next;
          local_70 = *pp_Var8;
        } while (*pp_Var8 != (_xmlNs *)0x0);
        bVar6 = !bVar6;
        elem = local_48;
      }
      elem_00 = p_Var16;
      if (!bVar6) goto LAB_0014f84a;
    }
    if ((p_Var16->type != XML_ELEMENT_NODE) ||
       (pxVar9 = (xmlNodePtr)p_Var16->properties, (xmlNodePtr)p_Var16->properties == (xmlNodePtr)0x0
       )) {
      while ((p_Var16->type != XML_ELEMENT_NODE ||
             (pxVar9 = p_Var16->children, p_Var16->children == (_xmlNode *)0x0))) {
LAB_0014f958:
        do {
          ppxVar13 = local_58;
          if (p_Var16 == elem) {
            if (local_58 != (xmlNsPtr *)0x0) {
              ppxVar21 = local_58;
              iVar15 = local_64;
              if (0 < local_64) {
                do {
                  xmlFreeNs(*ppxVar21);
                  iVar15 = iVar15 + -1;
                  ppxVar21 = ppxVar21 + 2;
                } while (iVar15 != 0);
              }
              (*xmlFree)(ppxVar13);
            }
            if (local_78 == (xmlNsMapItemPtr)0x0) {
              return uVar17;
            }
            xmlDOMWrapNsMapFree((xmlNsMapPtr)local_78);
            return uVar17;
          }
          xVar1 = p_Var16->type;
          if (xVar1 == XML_ELEMENT_NODE) {
            if ((local_78 != (xmlNsMapItemPtr)0x0) && (local_78->next != (xmlNsMapItemPtr)0x0)) {
              pxVar4 = (xmlNsPtr)local_78->prev;
              while ((pxVar12 = local_78, pxVar4 != (xmlNsPtr)0x0 &&
                     (iVar15 <= *(int *)((long)&pxVar4->_private + 4)))) {
                pxVar5 = *(xmlNsMapItemPtr *)&pxVar4->type;
                local_78->prev = pxVar5;
                pxVar14 = local_78;
                if (pxVar5 != (xmlNsMapItemPtr)0x0) {
                  pxVar14 = pxVar5;
                }
                pxVar14->next = (xmlNsMapItemPtr_conflict)0x0;
                pxVar4->next = local_78->oldNs;
                local_78->oldNs = pxVar4;
                pxVar4 = (xmlNsPtr)local_78->prev;
              }
              while (pxVar12 = pxVar12->next, pxVar12 != (xmlNsMapItemPtr_conflict)0x0) {
                if (iVar15 <= pxVar12->shadowDepth) {
                  pxVar12->shadowDepth = -1;
                }
              }
            }
            iVar15 = iVar15 + -1;
          }
          pxVar9 = p_Var16->next;
          if (p_Var16->next != (_xmlNode *)0x0) goto LAB_0014f62b;
          p_Var16 = p_Var16->parent;
        } while (xVar1 != XML_ATTRIBUTE_NODE);
      }
    }
  } while( true );
}

Assistant:

int
xmlDOMWrapReconcileNamespaces(xmlDOMWrapCtxtPtr ctxt ATTRIBUTE_UNUSED,
			      xmlNodePtr elem,
			      int options)
{
    int depth = -1, adoptns = 0, parnsdone = 0;
    xmlNsPtr ns, prevns;
    xmlDocPtr doc;
    xmlNodePtr cur, curElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr /* topmi = NULL, */ mi;
    /* @ancestorsOnly should be set by an option flag. */
    int ancestorsOnly = 0;
    int optRemoveRedundantNS =
	((xmlDOMReconcileNSOptions) options & XML_DOM_RECONNS_REMOVEREDUND) ? 1 : 0;
    xmlNsPtr *listRedund = NULL;
    int sizeRedund = 0, nbRedund = 0, ret = 0, i, j;

    if ((elem == NULL) || (elem->doc == NULL) ||
	(elem->type != XML_ELEMENT_NODE))
	return (-1);

    doc = elem->doc;
    cur = elem;
    do {
	switch (cur->type) {
	    case XML_ELEMENT_NODE:
		adoptns = 1;
		curElem = cur;
		depth++;
		/*
		* Namespace declarations.
		*/
		if (cur->nsDef != NULL) {
		    prevns = NULL;
		    ns = cur->nsDef;
		    while (ns != NULL) {
			if (! parnsdone) {
			    if ((elem->parent) &&
				((xmlNodePtr) elem->parent->doc != elem->parent)) {
				/*
				* Gather ancestor in-scope ns-decls.
				*/
				if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				    elem->parent) == -1)
				    ret = -1;
			    }
			    parnsdone = 1;
			}

			/*
			* Lookup the ns ancestor-axis for equal ns-decls in scope.
			*/
			if (optRemoveRedundantNS && XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				      xmlStrEqual(ns->prefix, mi->newNs->prefix)) &&
				    ((ns->href == mi->newNs->href) ||
				      xmlStrEqual(ns->href, mi->newNs->href)))
				{
				    /*
				    * A redundant ns-decl was found.
				    * Add it to the list of redundant ns-decls.
				    */
				    if (xmlDOMWrapNSNormAddNsMapItem2(&listRedund,
					&sizeRedund, &nbRedund, ns, mi->newNs) == -1) {
					ret = -1;
                                    } else {
                                        /*
                                        * Remove the ns-decl from the element-node.
                                        */
                                        if (prevns)
                                            prevns->next = ns->next;
                                        else
                                            cur->nsDef = ns->next;
                                        goto next_ns_decl;
                                    }
				}
			    }
			}

			/*
			* Skip ns-references handling if the referenced
			* ns-decl is declared on the same element.
			*/
			if ((cur->ns != NULL) && adoptns && (cur->ns == ns))
			    adoptns = 0;
			/*
			* Does it shadow any ns-decl?
			*/
			if (XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				    xmlStrEqual(ns->prefix, mi->newNs->prefix))) {

				    mi->shadowDepth = depth;
				}
			    }
			}
			/*
			* Push mapping.
			*/
			if (xmlDOMWrapNsMapAddItem(&nsMap, -1, ns, ns,
			    depth) == NULL)
			    ret = -1;

			prevns = ns;
next_ns_decl:
			ns = ns->next;
		    }
		}
		if (! adoptns)
		    goto ns_end;
                /* Falls through. */
	    case XML_ATTRIBUTE_NODE:
		/* No ns, no fun. */
		if (cur->ns == NULL)
		    goto ns_end;

		if (! parnsdone) {
		    if ((elem->parent) &&
			((xmlNodePtr) elem->parent->doc != elem->parent)) {
			if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				elem->parent) == -1)
			    ret = -1;
		    }
		    parnsdone = 1;
		}
		/*
		* Adjust the reference if this was a redundant ns-decl.
		*/
		if (listRedund) {
		   for (i = 0, j = 0; i < nbRedund; i++, j += 2) {
		       if (cur->ns == listRedund[j]) {
			   cur->ns = listRedund[++j];
			   break;
		       }
		   }
		}
		/*
		* Adopt ns-references.
		*/
		if (XML_NSMAP_NOTEMPTY(nsMap)) {
		    /*
		    * Search for a mapping.
		    */
		    XML_NSMAP_FOREACH(nsMap, mi) {
			if ((mi->shadowDepth == -1) &&
			    (cur->ns == mi->oldNs)) {

			    cur->ns = mi->newNs;
			    goto ns_end;
			}
		    }
		}
		/*
		* Acquire a normalized ns-decl and add it to the map.
		*/
		if (xmlDOMWrapNSNormAcquireNormalizedNs(doc, curElem,
			cur->ns, &ns,
			&nsMap, depth,
			ancestorsOnly,
			(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
		    ret = -1;
		cur->ns = ns;

ns_end:
		if ((cur->type == XML_ELEMENT_NODE) &&
		    (cur->properties != NULL)) {
		    /*
		    * Process attributes.
		    */
		    cur = (xmlNodePtr) cur->properties;
		    continue;
		}
		break;
	    default:
		goto next_sibling;
	}
into_content:
	if ((cur->type == XML_ELEMENT_NODE) &&
	    (cur->children != NULL)) {
	    /*
	    * Process content of element-nodes only.
	    */
	    cur = cur->children;
	    continue;
	}
next_sibling:
	if (cur == elem)
	    break;
	if (cur->type == XML_ELEMENT_NODE) {
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL)
	    cur = cur->next;
	else {
	    if (cur->type == XML_ATTRIBUTE_NODE) {
		cur = cur->parent;
		goto into_content;
	    }
	    cur = cur->parent;
	    goto next_sibling;
	}
    } while (cur != NULL);

    if (listRedund) {
	for (i = 0, j = 0; i < nbRedund; i++, j += 2) {
	    xmlFreeNs(listRedund[j]);
	}
	xmlFree(listRedund);
    }
    if (nsMap != NULL)
	xmlDOMWrapNsMapFree(nsMap);
    return (ret);
}